

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndTabBar(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiPtrOrIndex *pIVar3;
  ImGuiTabBar *pIVar4;
  float fVar5;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    pIVar4 = GImGui->CurrentTabBar;
    if (pIVar4 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Mismatched BeginTabBar()/EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x19fc,"void ImGui::EndTabBar()");
    }
    if (pIVar4->WantLayout == true) {
      TabBarLayout(pIVar4);
    }
    if (((pIVar4->VisibleTabWasSubmitted == false) && (pIVar4->VisibleTabId != 0)) &&
       (pIVar2->FrameCount <= pIVar4->PrevFrameVisible + 1)) {
      (pIVar1->DC).CursorPos.y = (pIVar4->BarRect).Max.y + pIVar4->LastTabContentHeight;
    }
    else {
      fVar5 = (pIVar1->DC).CursorPos.y - (pIVar4->BarRect).Max.y;
      pIVar4->LastTabContentHeight = (float)(-(uint)(0.0 <= fVar5) & (uint)fVar5);
    }
    if ((pIVar4->Flags & 0x100000) == 0) {
      PopID();
    }
    ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar2->CurrentTabBarStack);
    if ((pIVar2->CurrentTabBarStack).Size == 0) {
      pIVar4 = (ImGuiTabBar *)0x0;
    }
    else {
      pIVar3 = ImVector<ImGuiPtrOrIndex>::back(&pIVar2->CurrentTabBarStack);
      pIVar4 = (ImGuiTabBar *)pIVar3->Ptr;
      if (pIVar4 == (ImGuiTabBar *)0x0) {
        pIVar4 = ImVector<ImGuiTabBar>::operator[](&(GImGui->TabBars).Buf,pIVar3->Index);
      }
    }
    pIVar2->CurrentTabBar = pIVar4;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->LastTabContentHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->LastTabContentHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}